

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall
cmMakefile::AddEvaluationFile
          (cmMakefile *this,string *inputFile,string *targetName,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *outputName,
          unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
          *condition,string *newLineCharacter,mode_t permissions,bool inputIsContent)

{
  bool inputIsContent_local;
  unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>
  local_48;
  string *local_40;
  undefined4 local_34;
  
  inputIsContent_local = inputIsContent;
  local_40 = newLineCharacter;
  local_34 = cmStateSnapshot::GetPolicy(&this->StateSnapshot,CMP0070,false);
  std::
  make_unique<cmGeneratorExpressionEvaluationFile,std::__cxx11::string_const&,std::__cxx11::string_const&,std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,std::unique_ptr<cmCompiledGeneratorExpression,std::default_delete<cmCompiledGeneratorExpression>>,bool&,std::__cxx11::string_const&,unsigned_int&,cmPolicies::PolicyStatus>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_48,
             inputFile,
             (unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
              *)targetName,outputName,(bool *)condition,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &inputIsContent_local,(uint *)local_40,&permissions);
  std::
  vector<std::unique_ptr<cmGeneratorExpressionEvaluationFile,std::default_delete<cmGeneratorExpressionEvaluationFile>>,std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,std::default_delete<cmGeneratorExpressionEvaluationFile>>>>
  ::
  emplace_back<std::unique_ptr<cmGeneratorExpressionEvaluationFile,std::default_delete<cmGeneratorExpressionEvaluationFile>>>
            ((vector<std::unique_ptr<cmGeneratorExpressionEvaluationFile,std::default_delete<cmGeneratorExpressionEvaluationFile>>,std::allocator<std::unique_ptr<cmGeneratorExpressionEvaluationFile,std::default_delete<cmGeneratorExpressionEvaluationFile>>>>
              *)&this->EvaluationFiles,&local_48);
  std::
  unique_ptr<cmGeneratorExpressionEvaluationFile,_std::default_delete<cmGeneratorExpressionEvaluationFile>_>
  ::~unique_ptr(&local_48);
  return;
}

Assistant:

void cmMakefile::AddEvaluationFile(
  const std::string& inputFile, const std::string& targetName,
  std::unique_ptr<cmCompiledGeneratorExpression> outputName,
  std::unique_ptr<cmCompiledGeneratorExpression> condition,
  const std::string& newLineCharacter, mode_t permissions, bool inputIsContent)
{
  this->EvaluationFiles.push_back(
    cm::make_unique<cmGeneratorExpressionEvaluationFile>(
      inputFile, targetName, std::move(outputName), std::move(condition),
      inputIsContent, newLineCharacter, permissions,
      this->GetPolicyStatus(cmPolicies::CMP0070)));
}